

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

string * __thiscall
lest::
to_string<nonstd::expected_lite::unexpected_type<char>,nonstd::expected_lite::expected<int,char>>
          (string *__return_storage_ptr__,lest *this,unexpected_type<char> *lhs,string *op,
          expected<int,_char> *rhs)

{
  ostream *poVar1;
  unexpected_type<char> *item;
  expected<int,_char> *item_00;
  ostringstream os;
  ForNonContainerNonPointer<nonstd::expected_lite::unexpected_type<char>,_std::string> local_1d8;
  ForNonContainerNonPointer<nonstd::expected_lite::expected<int,_char>,_std::string> local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  to_string<nonstd::expected_lite::unexpected_type<char>>(&local_1d8,this,item);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,*(char **)lhs,*(long *)(lhs + 8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  to_string<nonstd::expected_lite::expected<int,char>>(&local_1b8,(lest *)op,item_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p == &local_1d8.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         local_1d8.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_1d8.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1d8._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         local_1d8.field_2._M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = local_1d8._M_string_length;
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( L const & lhs, std::string op, R const & rhs ) -> std::string
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}